

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_validation.cpp
# Opt level: O2

XrResult CoreValidationXrSetDebugUtilsObjectNameEXT
                   (XrInstance instance,XrDebugUtilsObjectNameInfoEXT *nameInfo)

{
  XrObjectType object_type;
  uint64_t object_handle;
  XrResult XVar1;
  allocator local_59;
  pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*> info_with_lock;
  string local_40;
  
  XVar1 = GenValidUsageInputsXrSetDebugUtilsObjectNameEXT(instance,nameInfo);
  if (XVar1 == XR_SUCCESS) {
    XVar1 = GenValidUsageNextXrSetDebugUtilsObjectNameEXT(instance,nameInfo);
    if (XVar1 == XR_SUCCESS) {
      HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::getWithLock
                (&info_with_lock,
                 &g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                 instance);
      if (info_with_lock.second != (GenValidUsageXrInstanceInfo *)0x0) {
        object_handle = nameInfo->objectHandle;
        object_type = nameInfo->objectType;
        std::__cxx11::string::string((string *)&local_40,nameInfo->objectName,&local_59);
        DebugUtilsData::AddObjectName
                  (&(info_with_lock.second)->debug_data,object_handle,object_type,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      std::unique_lock<std::mutex>::~unique_lock(&info_with_lock.first);
      XVar1 = XR_SUCCESS;
    }
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL CoreValidationXrSetDebugUtilsObjectNameEXT(XrInstance instance,
                                                                          const XrDebugUtilsObjectNameInfoEXT *nameInfo) {
    try {
        XrResult result = GenValidUsageInputsXrSetDebugUtilsObjectNameEXT(instance, nameInfo);
        if (!XR_UNQUALIFIED_SUCCESS(result)) {
            return result;
        }
        result = GenValidUsageNextXrSetDebugUtilsObjectNameEXT(instance, nameInfo);
        if (!XR_UNQUALIFIED_SUCCESS(result)) {
            return result;
        }
        auto info_with_lock = g_instance_info.getWithLock(instance);
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_lock.second;
        if (nullptr != gen_instance_info) {
            gen_instance_info->debug_data.AddObjectName(nameInfo->objectHandle, nameInfo->objectType, nameInfo->objectName);
        }
        return result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}